

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink>_>::
dispose(Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink>_>
        *this)

{
  AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink> *object;
  AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink> *ptrCopy;
  Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink>_>
  *this_local;
  
  object = this->ptr;
  if (object != (AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink> *)
                0x0) {
    this->ptr = (AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink> *)
                0x0;
    Disposer::
    dispose<kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncTee::ReadSink>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }